

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

void Omega_h::separate_upward_with_codes
               (LO nlh,LOs *lh2hl,Int nlows_per_high,Write<int> *lh2h,Bytes *down_codes,
               Write<signed_char> *codes)

{
  char *file;
  undefined1 local_120 [8];
  type f;
  allocator local_a1;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [39];
  ScopedTimer local_39;
  Write<signed_char> *pWStack_38;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> *codes_local;
  Bytes *down_codes_local;
  Write<int> *lh2h_local;
  Int nlows_per_high_local;
  LOs *lh2hl_local;
  LO nlh_local;
  
  pWStack_38 = codes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_a1);
  std::operator+(local_80,(char *)local_a0);
  std::__cxx11::to_string((__cxx11 *)&f.codes.shared_alloc_.direct_ptr,0xcd);
  std::operator+(local_60,local_80);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_39,"separate_upward_with_codes",file);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&f.codes.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  Read<int>::Read((Read<int> *)local_120,lh2hl);
  f.lh2hl.write_.shared_alloc_.direct_ptr._0_4_ = nlows_per_high;
  Write<int>::Write((Write<int> *)&f.nlows_per_high,lh2h);
  Read<signed_char>::Read((Read<signed_char> *)&f.lh2h.shared_alloc_.direct_ptr,down_codes);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.down_codes.write_.shared_alloc_.direct_ptr,codes);
  parallel_for<Omega_h::separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)::__0>
            (nlh,(type *)local_120);
  separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
  ::$_0::~__0((__0 *)local_120);
  ScopedTimer::~ScopedTimer(&local_39);
  return;
}

Assistant:

void separate_upward_with_codes(LO const nlh, LOs const lh2hl,
    Int const nlows_per_high, Write<LO> const lh2h, Bytes const down_codes,
    Write<Byte> const codes) {
  OMEGA_H_TIME_FUNCTION;
  auto f = OMEGA_H_LAMBDA(LO lh) {
    LO const hl = lh2hl[lh];
    LO const h = hl / nlows_per_high;
    lh2h[lh] = h;
    Int const which_down = hl % nlows_per_high;
    auto const down_code = down_codes[hl];
    bool const is_flipped = code_is_flipped(down_code);
    Int const rotation = code_rotation(down_code);
    codes[lh] = make_code(is_flipped, rotation, which_down);
  };
  parallel_for(nlh, std::move(f));
}